

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idn.c
# Opt level: O1

CURLcode Curl_idnconvert_hostname(hostname *host)

{
  host->dispname = host->name;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_idnconvert_hostname(struct hostname *host)
{
  /* set the name we use to display the hostname */
  host->dispname = host->name;

#ifdef USE_IDN
  /* Check name for non-ASCII and convert hostname if we can */
  if(!Curl_is_ASCII_name(host->name)) {
    char *decoded;
    CURLcode result = Curl_idn_decode(host->name, &decoded);
    if(result)
      return result;
    /* successful */
    host->name = host->encalloc = decoded;
  }
#endif
  return CURLE_OK;
}